

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.c
# Opt level: O1

void testAdjMatrixGraph(void)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  char i;
  Vertices vertex;
  long lVar4;
  Edges pEVar5;
  MatrixGraph matrixGraph;
  ulong uVar6;
  long lVar7;
  int *D;
  int_0_ *P;
  int_0_ *D_00;
  int_0_ *piVar8;
  undefined8 uStack_50;
  uint auStack_48 [2];
  long local_40;
  ulong local_38;
  
  uStack_50 = 0x108000;
  puts("*****************************************************");
  uStack_50 = 0x10800c;
  puts(&DAT_0010eccc);
  uStack_50 = 0x108014;
  puts("*****************************************************");
  uStack_50 = 0x10801e;
  vertex = (Vertices)malloc(5);
  lVar4 = 0;
  do {
    vertex[lVar4] = (char)lVar4 + 'a';
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  uStack_50 = 0x10803c;
  pEVar5 = newEdgeTestCase(5);
  uStack_50 = 0x10805a;
  matrixGraph = createAdjacencyMatrix(vertex,pEVar5,5,5,DN);
  uStack_50 = 0x108065;
  showMatrixGraph_AMG(matrixGraph);
  uStack_50 = 0x108072;
  pEVar5 = (Edges)realloc(pEVar5,0x54);
  pEVar5[5].vi = 1;
  pEVar5[5].vj = 3;
  *(undefined8 *)&pEVar5[5].weight = 0x30000003c;
  pEVar5[6].vj = 2;
  pEVar5[6].weight = 0x5a;
  uStack_50 = 0x10809b;
  newEdgeForGraphVertex_AMG(matrixGraph,pEVar5,7);
  uStack_50 = 0x1080a3;
  showMatrixGraph_AMG(matrixGraph);
  uStack_50 = 0x1080af;
  puts(&DAT_0010eeac);
  uStack_50 = 0x1080b7;
  dfsTraversal_AMG(matrixGraph);
  uStack_50 = 0x1080c3;
  puts(&DAT_0010eecb);
  uStack_50 = 0x1080cb;
  bfsTraversal_AMG(matrixGraph);
  uStack_50 = 0x1080d3;
  numOfConnectedComponents_AMG(matrixGraph);
  uStack_50 = 0x1080e3;
  printf(anon_var_dwarf_a7e1);
  uStack_50 = 0x1080ef;
  puts(&DAT_0010ed12);
  uStack_50 = 0x1080f7;
  miniSpanTree_Prim(matrixGraph);
  uStack_50 = 0x108103;
  puts(&DAT_0010ed39);
  uStack_50 = 0x10810b;
  miniSpanTree_Kruskal(matrixGraph);
  uStack_50 = 0x108117;
  puts(&DAT_0010ed62);
  lVar4 = -((ulong)(uint)matrixGraph->vexNum * 4 + 0xf & 0xfffffffffffffff0);
  D = (int *)((long)auStack_48 + lVar4);
  *(undefined8 *)((long)auStack_48 + lVar4 + -8) = 0x10813c;
  shortPath_Dijkstra(matrixGraph,0,D);
  if (0 < matrixGraph->vexNum) {
    lVar7 = 0;
    do {
      cVar1 = *matrixGraph->vertex;
      cVar2 = matrixGraph->vertex[lVar7];
      uVar3 = D[lVar7];
      *(undefined8 *)((long)auStack_48 + lVar4 + -8) = 0x108165;
      printf("%c -> %c : %d\n",(ulong)(uint)(int)cVar1,(ulong)(uint)(int)cVar2,(ulong)uVar3);
      lVar7 = lVar7 + 1;
    } while (lVar7 < matrixGraph->vexNum);
  }
  *(undefined8 *)((long)auStack_48 + lVar4 + -8) = 0x10817d;
  puts(&DAT_0010ed86);
  local_38 = (ulong)(uint)matrixGraph->vexNum;
  uVar6 = local_38 * local_38 * 4 + 0xf & 0xfffffffffffffff0;
  P = (int_0_ *)((long)D - uVar6);
  D_00 = P + -uVar6;
  *(undefined8 *)(D_00 + -8) = 0x1081b4;
  shortestPath_Floyd(matrixGraph,P,D_00);
  *(undefined8 *)(D_00 + -8) = 0x1081c0;
  puts(&DAT_0010eda7);
  if (0 < matrixGraph->vexNum) {
    local_40 = local_38 * 4;
    lVar4 = 0;
    piVar8 = D_00;
    do {
      if (0 < matrixGraph->vexNum) {
        lVar7 = 0;
        do {
          if (*(int *)(piVar8 + lVar7 * 4) == 0x7fff) {
            *(undefined8 *)(D_00 + -8) = 0x1081fc;
            printf(anon_var_dwarf_a86c);
          }
          else {
            *(undefined8 *)(D_00 + -8) = 0x10820c;
            printf("%d\t");
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < matrixGraph->vexNum);
      }
      *(undefined8 *)(D_00 + -8) = 0x108222;
      putchar(10);
      lVar4 = lVar4 + 1;
      piVar8 = piVar8 + local_40;
    } while (lVar4 < matrixGraph->vexNum);
  }
  *(undefined8 *)(D_00 + -8) = 0x10823e;
  puts(&DAT_0010edb2);
  if (0 < matrixGraph->vexNum) {
    local_38 = local_38 << 2;
    lVar4 = 0;
    do {
      if (0 < matrixGraph->vexNum) {
        lVar7 = 0;
        do {
          uVar3 = *(uint *)(P + lVar7 * 4);
          *(undefined8 *)(D_00 + -8) = 0x10826a;
          printf("%d\t",(ulong)uVar3);
          lVar7 = lVar7 + 1;
        } while (lVar7 < matrixGraph->vexNum);
      }
      *(undefined8 *)(D_00 + -8) = 0x108280;
      putchar(10);
      lVar4 = lVar4 + 1;
      P = P + local_38;
    } while (lVar4 < matrixGraph->vexNum);
  }
  *(undefined8 *)(D_00 + -8) = 0x10829c;
  puts(anon_var_dwarf_6286 + 0x43);
  return;
}

Assistant:

void testAdjMatrixGraph() {
    printf("*****************************************************\n");
    printf("*              邻接矩阵存储结构图测试例程              *\n");
    printf("*****************************************************\n");

    const int VERTEX_SIZE = 5;
    Vertices vertex = newVexTestCase(VERTEX_SIZE);

    // [a, b, c, d, e]
    Edges edge = newEdgeTestCase(VERTEX_SIZE);

    MatrixGraph matrix = createAdjacencyMatrix(vertex, edge, VERTEX_SIZE, VERTEX_SIZE, DN);
    showMatrixGraph_AMG(matrix);

    edge = reAllocEdge(VERTEX_SIZE, edge);

    newEdgeForGraphVertex_AMG(matrix, edge, VERTEX_SIZE + 2);
    showMatrixGraph_AMG(matrix);

    printf("深度优先遍历的结果：\n");
    dfsTraversal_AMG(matrix);

    printf("广度优先遍历的结果：\n");
    bfsTraversal_AMG(matrix);

    printf("连通分量的个数为：%d\n", numOfConnectedComponents_AMG(matrix));

    printf("Prime的算法计算最小生成树：\n");
    miniSpanTree_Prim(matrix);

    printf("Kruskal的算法计算最小生成树：\n");
    miniSpanTree_Kruskal(matrix);

    printf("Dijkstra算法计算最短路径：\n");
    int D[matrix->vexNum], V0 = 0;
    shortPath_Dijkstra(matrix, V0, D);
    for (int i = 0; i < matrix->vexNum; ++i)
        printf("%c -> %c : %d\n", matrix->vertex[V0], matrix->vertex[i], D[i]);

    printf("Floyd算法计算最短路径：\n");
    int P[matrix->vexNum][matrix->vexNum];
    int D_f[matrix->vexNum][matrix->vexNum];
    shortestPath_Floyd(matrix, P, D_f);
    printf("矩阵D：\n");
    for (int i = 0; i < matrix->vexNum; ++i) {
        for (int j = 0; j < matrix->vexNum; ++j)
            if (D_f[i][j] == UNFLAG_WEIGHT_GRAPH)
                printf("∞\t");
            else
                printf("%d\t", D_f[i][j]);
        printf("\n");
    }

    printf("矩阵P：\n");
    for (int i = 0; i < matrix->vexNum; ++i) {
        for (int j = 0; j < matrix->vexNum; ++j)
            printf("%d\t", P[i][j]);
        printf("\n");
    }
    puts("\n");
}